

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

void __thiscall SharedDirectory::index_files(SharedDirectory *this)

{
  type_conflict1 tVar1;
  bool bVar2;
  pointer pdVar3;
  path *ppVar4;
  string *__args;
  uint64_t local_e8;
  path local_80;
  uintmax_t local_60;
  uint64_t size;
  path file;
  directory_iterator local_28;
  directory_iterator itr;
  uint64_t actual_space;
  directory_iterator end;
  SharedDirectory *this_local;
  
  end.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)this;
  boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)&actual_space);
  itr.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear(&this->indexed_files);
  boost::filesystem::directory_iterator::directory_iterator(&local_28,&this->shared_dir,none);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&local_28,
                            (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&actual_space), tVar1) {
    pdVar3 = boost::iterators::detail::
             iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                           *)&local_28);
    ppVar4 = boost::filesystem::directory_entry::path(pdVar3);
    boost::filesystem::path::path((path *)&size,ppVar4);
    pdVar3 = boost::iterators::detail::
             iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                           *)&local_28);
    ppVar4 = boost::filesystem::directory_entry::path(pdVar3);
    bVar2 = boost::filesystem::is_regular_file(ppVar4);
    if (bVar2) {
      local_60 = boost::filesystem::file_size((path *)&size);
      itr.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                     ((long)itr.m_imp.px + local_60);
      boost::filesystem::path::filename();
      __args = boost::filesystem::path::string_abi_cxx11_(&local_80);
      std::
      map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::emplace<std::__cxx11::string_const&,unsigned_long&>
                ((map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)this,__args,&local_60);
      boost::filesystem::path::~path(&local_80);
      file.m_pathname.field_2._8_4_ = 0;
    }
    else {
      file.m_pathname.field_2._8_4_ = 4;
    }
    boost::filesystem::path::~path((path *)&size);
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                  *)&local_28);
  }
  file.m_pathname.field_2._8_4_ = 2;
  boost::filesystem::directory_iterator::~directory_iterator(&local_28);
  if ((dir_itr_imp *)this->total_space < (ulong)itr.m_imp.px) {
    local_e8 = 0;
  }
  else {
    local_e8 = this->total_space - (long)itr.m_imp.px;
  }
  this->remaining_space = local_e8;
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&actual_space);
  return;
}

Assistant:

void SharedDirectory::index_files() {
  directory_iterator end;
  uint64_t actual_space = 0;
  indexed_files.clear();
  for (directory_iterator itr{shared_dir}; itr != end; ++itr) {
    auto file = itr->path();
    if (!is_regular_file(itr->path())) {
      continue;
    }
    uint64_t size = file_size(file);
    actual_space += size;
    indexed_files.emplace(file.filename().string(), size);
  }
  remaining_space = total_space < actual_space ? 0 : total_space - actual_space;
}